

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Window * sqlite3WindowDup(sqlite3 *db,Expr *pOwner,Window *p)

{
  char *pcVar1;
  Expr *pEVar2;
  ExprList *pEVar3;
  sqlite3 *in_RDX;
  sqlite3 *in_RSI;
  Window *pNew;
  sqlite3 *in_stack_00000028;
  u64 in_stack_ffffffffffffffd8;
  Window *z;
  
  z = (Window *)0x0;
  if ((in_RDX != (sqlite3 *)0x0) &&
     (z = (Window *)sqlite3DbMallocZero((sqlite3 *)0x0,in_stack_ffffffffffffffd8),
     z != (Window *)0x0)) {
    pcVar1 = sqlite3DbStrDup(in_RDX,(char *)z);
    z->zName = pcVar1;
    pcVar1 = sqlite3DbStrDup(in_RDX,(char *)z);
    z->zBase = pcVar1;
    pEVar2 = sqlite3ExprDup(in_RSI,(Expr *)in_RDX,(int)((ulong)z >> 0x20));
    z->pFilter = pEVar2;
    z->pWFunc = *(FuncDef **)&in_RDX->errCode;
    pEVar3 = sqlite3ExprListDup(in_stack_00000028,(ExprList *)db,pOwner._4_4_);
    z->pPartition = pEVar3;
    pEVar3 = sqlite3ExprListDup(in_stack_00000028,(ExprList *)db,pOwner._4_4_);
    z->pOrderBy = pEVar3;
    z->eFrmType = *(u8 *)&in_RDX->aDb;
    z->eEnd = *(u8 *)((long)&in_RDX->aDb + 2);
    z->eStart = *(u8 *)((long)&in_RDX->aDb + 1);
    z->eExclude = *(u8 *)((long)&in_RDX->aDb + 4);
    z->regResult = in_RDX->dbOptFlags;
    z->regAccum = in_RDX->iSysErrno;
    z->iArgCol = *(int *)((long)&in_RDX->nChange + 4);
    z->iEphCsr = in_RDX->errMask;
    z->bExprArgs = (u8)in_RDX->aLimit[1];
    pEVar2 = sqlite3ExprDup(in_RSI,(Expr *)in_RDX,(int)((ulong)z >> 0x20));
    z->pStart = pEVar2;
    pEVar2 = sqlite3ExprDup(in_RSI,(Expr *)in_RDX,(int)((ulong)z >> 0x20));
    z->pEnd = pEVar2;
    z->pOwner = (Expr *)in_RSI;
    z->bImplicitFrame = *(u8 *)((long)&in_RDX->aDb + 3);
  }
  return z;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowDup(sqlite3 *db, Expr *pOwner, Window *p){
  Window *pNew = 0;
  if( ALWAYS(p) ){
    pNew = sqlite3DbMallocZero(db, sizeof(Window));
    if( pNew ){
      pNew->zName = sqlite3DbStrDup(db, p->zName);
      pNew->zBase = sqlite3DbStrDup(db, p->zBase);
      pNew->pFilter = sqlite3ExprDup(db, p->pFilter, 0);
      pNew->pWFunc = p->pWFunc;
      pNew->pPartition = sqlite3ExprListDup(db, p->pPartition, 0);
      pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, 0);
      pNew->eFrmType = p->eFrmType;
      pNew->eEnd = p->eEnd;
      pNew->eStart = p->eStart;
      pNew->eExclude = p->eExclude;
      pNew->regResult = p->regResult;
      pNew->regAccum = p->regAccum;
      pNew->iArgCol = p->iArgCol;
      pNew->iEphCsr = p->iEphCsr;
      pNew->bExprArgs = p->bExprArgs;
      pNew->pStart = sqlite3ExprDup(db, p->pStart, 0);
      pNew->pEnd = sqlite3ExprDup(db, p->pEnd, 0);
      pNew->pOwner = pOwner;
      pNew->bImplicitFrame = p->bImplicitFrame;
    }
  }
  return pNew;
}